

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlWriter::writeStylesheetRef(XmlWriter *this,string *url)

{
  ostream *poVar1;
  string *url_local;
  XmlWriter *this_local;
  
  poVar1 = std::operator<<((ostream *)this->m_os,"<?xml-stylesheet type=\"text/xsl\" href=\"");
  poVar1 = std::operator<<(poVar1,(string *)url);
  std::operator<<(poVar1,"\"?>\n");
  return;
}

Assistant:

void XmlWriter::writeStylesheetRef( std::string const& url ) {
        m_os << "<?xml-stylesheet type=\"text/xsl\" href=\"" << url << "\"?>\n";
    }